

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptPromise.cpp
# Opt level: O0

void __thiscall
Js::JavascriptPromise::MarkVisitKindSpecificPtrs
          (JavascriptPromise *this,SnapshotExtractor *extractor)

{
  SnapshotExtractor *this_00;
  void **ppvVar1;
  SList<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount> **ppSVar2;
  SList<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount> *this_01;
  SnapshotExtractor *local_18;
  SnapshotExtractor *extractor_local;
  JavascriptPromise *this_local;
  
  local_18 = extractor;
  extractor_local = (SnapshotExtractor *)this;
  ppvVar1 = Memory::WriteBarrierPtr::operator_cast_to_void__((WriteBarrierPtr *)&this->result);
  this_00 = local_18;
  if (*ppvVar1 != (void *)0x0) {
    ppvVar1 = Memory::WriteBarrierPtr::operator_cast_to_void__((WriteBarrierPtr *)&this->result);
    TTD::SnapshotExtractor::MarkVisitVar(this_00,*ppvVar1);
  }
  ppSVar2 = Memory::WriteBarrierPtr::operator_cast_to_SList__((WriteBarrierPtr *)&this->reactions);
  if (*ppSVar2 != (SList<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount> *)0x0) {
    this_01 = Memory::
              WriteBarrierPtr<SList<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount>_>
              ::operator->(&this->reactions);
    SListBase<Js::JavascriptPromiseReactionPair,Memory::Recycler,RealCount>::
    Map<Js::JavascriptPromise::MarkVisitKindSpecificPtrs(TTD::SnapshotExtractor*)::__0>
              ((SListBase<Js::JavascriptPromiseReactionPair,Memory::Recycler,RealCount> *)this_01,
               (anon_class_8_1_068654c4_for_fn)&local_18);
  }
  return;
}

Assistant:

void JavascriptPromise::MarkVisitKindSpecificPtrs(TTD::SnapshotExtractor* extractor)
    {
        if(this->result != nullptr)
        {
            extractor->MarkVisitVar(this->result);
        }

        if(this->reactions != nullptr)
        {
            this->reactions->Map([&](JavascriptPromiseReactionPair pair) {
                pair.rejectReaction->MarkVisitPtrs(extractor);
                pair.resolveReaction->MarkVisitPtrs(extractor);
            });
        }
    }